

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int tremove(lua_State *L)

{
  int n;
  size_t sVar1;
  lua_Integer lVar2;
  undefined4 local_20;
  int pos;
  int e;
  lua_State *L_local;
  
  luaL_checktype(L,1,5);
  sVar1 = lua_objlen(L,1);
  n = (int)sVar1;
  lVar2 = luaL_optinteger(L,2,(long)n);
  local_20 = (int)lVar2;
  if ((local_20 < 1) || (n < local_20)) {
    L_local._4_4_ = 0;
  }
  else {
    lua_rawgeti(L,1,local_20);
    for (; local_20 < n; local_20 = local_20 + 1) {
      lua_rawgeti(L,1,local_20 + 1);
      lua_rawseti(L,1,local_20);
    }
    lua_pushnil(L);
    lua_rawseti(L,1,n);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int tremove(lua_State*L){
int e=aux_getn(L,1);
int pos=luaL_optint(L,2,e);
if(!(1<=pos&&pos<=e))
return 0;
luaL_setn(L,1,e-1);
lua_rawgeti(L,1,pos);
for(;pos<e;pos++){
lua_rawgeti(L,1,pos+1);
lua_rawseti(L,1,pos);
}
lua_pushnil(L);
lua_rawseti(L,1,e);
return 1;
}